

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

bool ot::commissioner::tlv::IsExtendedTlv(Type aType)

{
  bool local_9;
  Type aType_local;
  
  if (((aType == kJoinerDtlsEncapsulation) || (aType == kUdpEncapsulation)) ||
     (aType == kCommissionerToken)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool IsExtendedTlv(Type aType)
{
    switch (aType)
    {
    case Type::kUdpEncapsulation:
    case Type::kCommissionerToken:
    case Type::kJoinerDtlsEncapsulation:
        return true;
    default:
        return false;
    }
}